

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall ft::list<int,_ft::allocator<int>_>::pop_back(list<int,_ft::allocator<int>_> *this)

{
  node *pnVar1;
  listNode<int> *plVar2;
  listNode<int> *plVar3;
  
  pnVar1 = this->m_tail;
  plVar2 = pnVar1->prev;
  plVar3 = plVar2->prev;
  pnVar1->prev = plVar3;
  plVar3->next = pnVar1;
  operator_delete(plVar2);
  this->m_size = this->m_size - 1;
  return;
}

Assistant:

void pop_back() {
		node*	delNode = this->tail()->prev;
		this->tail()->prev = delNode->prev;
		this->tail()->prev->next = this->tail();
		this->m_alloc.destroy(delNode);
		this->m_alloc.deallocate(delNode, 1);
		--this->m_size;
	}